

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::DisableForkStatementSyntax::setChild
          (DisableForkStatementSyntax *this,size_t index,TokenOrSyntax child)

{
  Info *pIVar1;
  size_type sVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar6;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar7;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar8;
  NamedLabelSyntax *pNVar9;
  logic_error *this_00;
  long *plVar10;
  size_type *psVar11;
  long *plVar12;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (4 < index) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O3/extern/slang/source/AllSyntax.cpp"
               ,"");
    plVar10 = (long *)std::__cxx11::string::append((char *)local_d0);
    local_b0._M_dataplus._M_p = (pointer)*plVar10;
    psVar11 = (size_type *)(plVar10 + 2);
    if ((size_type *)local_b0._M_dataplus._M_p == psVar11) {
      local_b0.field_2._M_allocated_capacity = *psVar11;
      local_b0.field_2._8_8_ = plVar10[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar11;
    }
    local_b0._M_string_length = plVar10[1];
    *plVar10 = (long)psVar11;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::to_string(&local_70,0x115b);
    std::operator+(&local_50,&local_b0,&local_70);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = (long *)*plVar10;
    plVar12 = plVar10 + 2;
    if (local_90 == plVar12) {
      local_80 = *plVar12;
      lStack_78 = plVar10[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar12;
    }
    local_88 = plVar10[1];
    *plVar10 = (long)plVar12;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_f0 = (long *)*plVar10;
    plVar12 = plVar10 + 2;
    if (local_f0 == plVar12) {
      local_e0 = *plVar12;
      lStack_d8 = plVar10[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar12;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar12;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::logic_error::logic_error(this_00,(string *)&local_f0);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  switch(index) {
  case 0:
    ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar7 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pNVar9 = (NamedLabelSyntax *)0x0;
    }
    else {
      ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pNVar9 = (NamedLabelSyntax *)*ppSVar7;
      if ((pNVar9->super_SyntaxNode).kind != NamedLabel) {
        assert::assertFailed
                  ("T::isKind(kind)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/syntax/SyntaxNode.h"
                   ,0x68,"T &slang::syntax::SyntaxNode::as() [T = slang::syntax::NamedLabelSyntax]")
        ;
      }
    }
    (this->super_StatementSyntax).label = pNVar9;
    break;
  case 1:
    ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    pSVar8 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                       (*ppSVar7);
    (this->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
         (pSVar8->super_SyntaxListBase).super_SyntaxNode.parent;
    (this->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
         (pSVar8->super_SyntaxListBase).super_SyntaxNode.kind;
    (this->super_StatementSyntax).attributes.super_SyntaxListBase.childCount =
         (pSVar8->super_SyntaxListBase).childCount;
    sVar2 = (pSVar8->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
            size_;
    (this->super_StatementSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
         (pSVar8->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
         data_;
    (this->super_StatementSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar2;
    break;
  case 2:
    pvVar6 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar6->field_0x2;
    NVar4.raw = (pvVar6->numFlags).raw;
    uVar5 = pvVar6->rawLen;
    pIVar1 = pvVar6->info;
    (this->disable).kind = pvVar6->kind;
    (this->disable).field_0x2 = uVar3;
    (this->disable).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->disable).rawLen = uVar5;
    (this->disable).info = pIVar1;
    break;
  case 3:
    pvVar6 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar6->field_0x2;
    NVar4.raw = (pvVar6->numFlags).raw;
    uVar5 = pvVar6->rawLen;
    pIVar1 = pvVar6->info;
    (this->fork).kind = pvVar6->kind;
    (this->fork).field_0x2 = uVar3;
    (this->fork).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->fork).rawLen = uVar5;
    (this->fork).info = pIVar1;
    break;
  case 4:
    pvVar6 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar6->field_0x2;
    NVar4.raw = (pvVar6->numFlags).raw;
    uVar5 = pvVar6->rawLen;
    pIVar1 = pvVar6->info;
    (this->semi).kind = pvVar6->kind;
    (this->semi).field_0x2 = uVar3;
    (this->semi).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->semi).rawLen = uVar5;
    (this->semi).info = pIVar1;
  }
  return;
}

Assistant:

void DisableForkStatementSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 1: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 2: disable = child.token(); return;
        case 3: fork = child.token(); return;
        case 4: semi = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}